

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

void arg_set_module_version(int major,int minor,int patch,char *tag)

{
  size_t sVar1;
  char *pcVar2;
  arg_dstr_t ds;
  char *__dest;
  
  s_mod_ver_major = major;
  s_mod_ver_minor = minor;
  s_mod_ver_patch = patch;
  free(s_mod_ver_tag);
  sVar1 = strlen(tag);
  pcVar2 = (char *)calloc(1,sVar1 + 1);
  if (pcVar2 == (char *)0x0) {
    (*s_panic)("Out of memory!\n");
  }
  s_mod_ver_tag = pcVar2;
  memcpy(pcVar2,tag,sVar1);
  ds = (arg_dstr_t)calloc(1,0xf0);
  if (ds == (arg_dstr_t)0x0) {
    (*s_panic)("Out of memory!\n");
  }
  ds->data = ds->sbuf;
  arg_dstr_catf(ds,"%d.",(ulong)(uint)s_mod_ver_major);
  arg_dstr_catf(ds,"%d.",(ulong)(uint)s_mod_ver_minor);
  arg_dstr_catf(ds,"%d.",(ulong)(uint)s_mod_ver_patch);
  arg_dstr_cat(ds,s_mod_ver_tag);
  free(s_mod_ver);
  pcVar2 = ds->data;
  sVar1 = strlen(pcVar2);
  __dest = (char *)calloc(1,sVar1 + 1);
  if (__dest == (char *)0x0) {
    (*s_panic)("Out of memory!\n");
    pcVar2 = ds->data;
  }
  s_mod_ver = __dest;
  memcpy(__dest,pcVar2,sVar1);
  arg_dstr_reset(ds);
  free(ds);
  return;
}

Assistant:

void arg_set_module_version(int major, int minor, int patch, const char* tag) {
    size_t slen_tag, slen_ds;
    arg_dstr_t ds;

    s_mod_ver_major = major;
    s_mod_ver_minor = minor;
    s_mod_ver_patch = patch;

    xfree(s_mod_ver_tag);
    slen_tag = strlen(tag);
    s_mod_ver_tag = (char*)xmalloc(slen_tag + 1);
    memset(s_mod_ver_tag, 0, slen_tag + 1);

#if (defined(__STDC_LIB_EXT1__) && defined(__STDC_WANT_LIB_EXT1__)) || (defined(__STDC_SECURE_LIB__) && defined(__STDC_WANT_SECURE_LIB__))
    strncpy_s(s_mod_ver_tag, slen_tag + 1, tag, slen_tag);
#else
    memcpy(s_mod_ver_tag, tag, slen_tag);
#endif

    ds = arg_dstr_create();
    arg_dstr_catf(ds, "%d.", s_mod_ver_major);
    arg_dstr_catf(ds, "%d.", s_mod_ver_minor);
    arg_dstr_catf(ds, "%d.", s_mod_ver_patch);
    arg_dstr_cat(ds, s_mod_ver_tag);

    xfree(s_mod_ver);
    slen_ds = strlen(arg_dstr_cstr(ds));
    s_mod_ver = (char*)xmalloc(slen_ds + 1);
    memset(s_mod_ver, 0, slen_ds + 1);

#if (defined(__STDC_LIB_EXT1__) && defined(__STDC_WANT_LIB_EXT1__)) || (defined(__STDC_SECURE_LIB__) && defined(__STDC_WANT_SECURE_LIB__))
    strncpy_s(s_mod_ver, slen_ds + 1, arg_dstr_cstr(ds), slen_ds);
#else
    memcpy(s_mod_ver, arg_dstr_cstr(ds), slen_ds);
#endif

    arg_dstr_destroy(ds);
}